

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf_write.h
# Opt level: O0

void cgltf_write_floatarrayprop
               (cgltf_write_context *context,char *label,cgltf_float *vals,cgltf_size dim)

{
  int iVar1;
  ulong local_30;
  cgltf_size i;
  cgltf_size dim_local;
  cgltf_float *vals_local;
  char *label_local;
  cgltf_write_context *context_local;
  
  cgltf_write_indent(context);
  iVar1 = snprintf(context->cursor,context->remaining,"\"%s\": [",label);
  context->tmp = (long)iVar1;
  context->chars_written = context->tmp + context->chars_written;
  if (context->cursor != (char *)0x0) {
    context->cursor = context->cursor + context->tmp;
    context->remaining = context->remaining - context->tmp;
  }
  for (local_30 = 0; local_30 < dim; local_30 = local_30 + 1) {
    if (local_30 == 0) {
      iVar1 = snprintf(context->cursor,context->remaining,"%.*g",(double)*vals,9);
      context->tmp = (long)iVar1;
      context->chars_written = context->tmp + context->chars_written;
      if (context->cursor != (char *)0x0) {
        context->cursor = context->cursor + context->tmp;
        context->remaining = context->remaining - context->tmp;
      }
    }
    else {
      iVar1 = snprintf(context->cursor,context->remaining,", %.*g",(double)vals[local_30],9);
      context->tmp = (long)iVar1;
      context->chars_written = context->tmp + context->chars_written;
      if (context->cursor != (char *)0x0) {
        context->cursor = context->cursor + context->tmp;
        context->remaining = context->remaining - context->tmp;
      }
    }
  }
  iVar1 = snprintf(context->cursor,context->remaining,"]");
  context->tmp = (long)iVar1;
  context->chars_written = context->tmp + context->chars_written;
  if (context->cursor != (char *)0x0) {
    context->cursor = context->cursor + context->tmp;
    context->remaining = context->remaining - context->tmp;
  }
  context->needs_comma = 1;
  return;
}

Assistant:

static void cgltf_write_floatarrayprop(cgltf_write_context* context, const char* label, const cgltf_float* vals, cgltf_size dim)
{
	cgltf_write_indent(context);
	CGLTF_SPRINTF("\"%s\": [", label);
	for (cgltf_size i = 0; i < dim; ++i)
	{
		if (i != 0)
		{
			CGLTF_SPRINTF(", %.*g", CGLTF_DECIMAL_DIG, vals[i]);
		}
		else
		{
			CGLTF_SPRINTF("%.*g", CGLTF_DECIMAL_DIG, vals[i]);
		}
	}
	CGLTF_SPRINTF("]");
	context->needs_comma = 1;
}